

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

UnitsMultipliers * __thiscall
libcellml::Analyser::AnalyserImpl::multiplyDivideUnitsMultipliers
          (UnitsMultipliers *__return_storage_ptr__,AnalyserImpl *this,double firstUnitsMultiplier,
          UnitsMultipliers *secondUnitsMultipliers,bool multiply)

{
  double *pdVar1;
  iterator __position;
  double *secondUnitsMultiplier;
  double *pdVar2;
  double dVar3;
  double local_28;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar2 = (secondUnitsMultipliers->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (secondUnitsMultipliers->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar1) {
    if (multiply) {
      dVar3 = 1.0;
    }
    else {
      dVar3 = -1.0;
    }
    do {
      local_28 = *pdVar2 * dVar3 + firstUnitsMultiplier;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != pdVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

UnitsMultipliers Analyser::AnalyserImpl::multiplyDivideUnitsMultipliers(double firstUnitsMultiplier,
                                                                        const UnitsMultipliers &secondUnitsMultipliers,
                                                                        bool multiply)
{
    // Multiply/divide the given units multipliers together, following a
    // multiplication (multiply = true) or a division (multiply = false).

    UnitsMultipliers res;

    for (const auto &secondUnitsMultiplier : secondUnitsMultipliers) {
        res.push_back(multiplyDivideUnitsMultipliers(firstUnitsMultiplier,
                                                     secondUnitsMultiplier,
                                                     multiply));
    }

    return res;
}